

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

void __thiscall
p2t::Sweep::FillLeftConcaveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  double dVar1;
  Point *pPVar2;
  Point *pPVar3;
  double dVar4;
  
  while( true ) {
    Fill(this,tcx,node->prev);
    pPVar2 = node->prev->point;
    pPVar3 = edge->p;
    if (pPVar2 == pPVar3) {
      return;
    }
    dVar4 = (pPVar2->y - pPVar3->y) * (edge->q->x - pPVar3->x) -
            (pPVar2->x - pPVar3->x) * (edge->q->y - pPVar3->y);
    if (ABS(dVar4) < 1e-12) {
      return;
    }
    if (0.0 < dVar4) {
      return;
    }
    pPVar3 = node->prev->prev->point;
    dVar4 = pPVar3->x;
    dVar1 = pPVar3->y;
    dVar4 = (pPVar2->y - dVar1) * (node->point->x - dVar4) -
            (pPVar2->x - dVar4) * (node->point->y - dVar1);
    if (ABS(dVar4) < 1e-12) break;
    if (0.0 < dVar4) {
      return;
    }
  }
  return;
}

Assistant:

void Sweep::FillLeftConcaveEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  Fill(tcx, *node.prev);
  if (node.prev->point != edge->p) {
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.prev->point, *edge->p) == CW) {
      // Below
      if (Orient2d(*node.point, *node.prev->point, *node.prev->prev->point) == CW) {
        // Next is concave
        FillLeftConcaveEdgeEvent(tcx, edge, node);
      } else{
        // Next is convex
      }
    }
  }

}